

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

int Imf_3_4::numLinesInBuffer(Compression comp)

{
  int iVar1;
  int iVar2;
  ArgExc *pAVar3;
  Compression in_EDI;
  int numScanlines;
  
  iVar1 = getCompressionNumScanlines(in_EDI);
  iVar2 = exr_compression_lines_per_chunk(in_EDI);
  if (iVar2 != iVar1) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Mismatch in compression lines per chunk");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (iVar1 < 1) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unknown compression type");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return iVar1;
}

Assistant:

int
numLinesInBuffer (Compression comp)
{
    int numScanlines = getCompressionNumScanlines (comp);
    if (exr_compression_lines_per_chunk ((exr_compression_t)comp) != numScanlines)
        throw IEX_NAMESPACE::ArgExc ("Mismatch in compression lines per chunk");
    if (numScanlines < 1)
        throw IEX_NAMESPACE::ArgExc ("Unknown compression type");
    return numScanlines;
}